

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLSceneLoader.cpp
# Opt level: O3

bool __thiscall
COLLADASaxFWL::SceneLoader::begin__instance_kinematics_scene
          (SceneLoader *this,instance_kinematics_scene__AttributeData *attributeData)

{
  int iVar1;
  KinematicsInstanceKinematicsScene *pKVar2;
  undefined4 extraout_var;
  URI *baseURI;
  String *uriStr;
  URI url;
  URI UStack_1e8;
  URI local_100;
  
  pKVar2 = (KinematicsInstanceKinematicsScene *)operator_new(0x108);
  pKVar2->_vptr_KinematicsInstanceKinematicsScene =
       (_func_int **)&PTR__KinematicsInstanceKinematicsScene_009049b0;
  COLLADABU::URI::URI(&pKVar2->mUrl);
  (pKVar2->mBindJointAxes).
  super__Vector_base<COLLADASaxFWL::KinematicsBindJointAxis_*,_std::allocator<COLLADASaxFWL::KinematicsBindJointAxis_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pKVar2->mBindJointAxes).
  super__Vector_base<COLLADASaxFWL::KinematicsBindJointAxis_*,_std::allocator<COLLADASaxFWL::KinematicsBindJointAxis_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pKVar2->mBindJointAxes).
  super__Vector_base<COLLADASaxFWL::KinematicsBindJointAxis_*,_std::allocator<COLLADASaxFWL::KinematicsBindJointAxis_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->mCurrentInstanceKinematicsScene = pKVar2;
  iVar1 = (*(this->super_FilePartLoader).super_IFilePartLoader.super_ExtraDataLoader.
            _vptr_ExtraDataLoader[2])(this);
  baseURI = (URI *)(**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x58))
                             ((long *)CONCAT44(extraout_var,iVar1));
  uriStr = COLLADABU::URI::getURIString_abi_cxx11_(&attributeData->url);
  COLLADABU::URI::URI(&local_100,baseURI,uriStr);
  pKVar2 = this->mCurrentInstanceKinematicsScene;
  COLLADABU::URI::URI(&UStack_1e8,&local_100,false);
  COLLADABU::URI::operator=(&pKVar2->mUrl,&UStack_1e8);
  COLLADABU::URI::~URI(&UStack_1e8);
  COLLADABU::URI::~URI(&local_100);
  return true;
}

Assistant:

bool SceneLoader::begin__instance_kinematics_scene( const instance_kinematics_scene__AttributeData& attributeData )
	{
		mCurrentInstanceKinematicsScene = new KinematicsInstanceKinematicsScene();
		const COLLADABU::URI& fileUri = getFileLoader()->getFileUri();
		COLLADABU::URI url(fileUri, attributeData.url.getURIString());
		mCurrentInstanceKinematicsScene->setUrl( url);
		return true;
	}